

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::Configurations::unsafeSet
          (Configurations *this,Level level,ConfigurationType configurationType,string *value)

{
  Configuration *this_00;
  void *pvVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *in_RDI;
  bool in_stack_0000001f;
  string *in_stack_00000020;
  Configuration *conf;
  string *in_stack_ffffffffffffffb8;
  Configuration *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffd0;
  ConfigurationType in_stack_ffffffffffffffd8;
  Level in_stack_ffffffffffffffdc;
  
  this_00 = el::base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
            get<el::Level,el::ConfigurationType>
                      (in_RDI,(Level *)CONCAT44(in_ESI,in_EDX),
                       (ConfigurationType)((ulong)in_RCX >> 0x20));
  if (this_00 == (Configuration *)0x0) {
    pvVar1 = operator_new(0x30);
    Configuration::Configuration
              (this_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
              );
    (*(in_RDI->
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[0x10])(in_RDI,pvVar1);
  }
  else {
    Configuration::setValue(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (in_ESI == 1) {
    unsafeSetGlobally((Configurations *)value,conf._4_4_,in_stack_00000020,in_stack_0000001f);
  }
  return;
}

Assistant:

void Configurations::unsafeSet(Level level, ConfigurationType configurationType, const std::string& value) {
  Configuration* conf = RegistryWithPred<Configuration, Configuration::Predicate>::get(level, configurationType);
  if (conf == nullptr) {
    registerNew(new Configuration(level, configurationType, value));
  } else {
    conf->setValue(value);
  }
  if (level == Level::Global) {
    unsafeSetGlobally(configurationType, value, false);
  }
}